

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItemLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  undefined1 *puVar13;
  undefined1 *buffer;
  byte unaff_R13B;
  uint32 uVar14;
  undefined1 local_b8 [8];
  CodedInputStream sub_input;
  string message_data;
  
  sub_input.extension_factory_ = (MessageFactory *)&message_data._M_string_length;
  message_data._M_dataplus._M_p = (pointer)0x0;
  message_data._M_string_length._0_1_ = 0;
  iVar12 = 0;
  message_data.field_2._8_8_ = field_skipper;
  do {
    pbVar1 = input->buffer_;
    uVar7 = 0;
    if ((pbVar1 < input->buffer_end_) && (uVar7 = (uint)*pbVar1, -1 < (char)*pbVar1)) {
      input->buffer_ = pbVar1 + 1;
    }
    else {
      uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
    }
    if ((int)uVar7 < 0x10) {
      if (uVar7 == 0) {
LAB_00219f29:
        bVar2 = false;
        unaff_R13B = 0;
      }
      else {
        if (uVar7 != 0xc) {
LAB_00219f12:
          iVar8 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)uVar7);
          cVar4 = (char)iVar8;
LAB_00219f21:
          if (cVar4 == '\0') goto LAB_00219f29;
          goto LAB_0021a140;
        }
        unaff_R13B = 1;
        bVar2 = false;
      }
    }
    else {
      if (uVar7 != 0x10) {
        if (uVar7 != 0x1a) goto LAB_00219f12;
        if (iVar12 != 0) {
          cVar4 = ParseField(this,iVar12 * 8 + 2,input,extension_finder,field_skipper);
          goto LAB_00219f21;
        }
        pbVar1 = input->buffer_;
        if (pbVar1 < input->buffer_end_) {
          bVar5 = *pbVar1;
          uVar11 = (ulong)bVar5;
          uVar14 = (uint32)bVar5;
          if ((char)bVar5 < '\0') goto LAB_0021a087;
          input->buffer_ = pbVar1 + 1;
          bVar5 = 0;
        }
        else {
          uVar14 = 0;
LAB_0021a087:
          uVar11 = io::CodedInputStream::ReadVarint32Fallback(input,uVar14);
          bVar5 = (byte)(uVar11 >> 0x3f);
        }
        uVar7 = (uint)uVar11;
        iVar12 = 0;
        bVar6 = false;
        bVar3 = 0;
        if (-1 < (int)uVar7 && bVar5 == 0) {
          iVar8 = 0x1f;
          if ((uVar7 | 1) != 0) {
            for (; (uVar7 | 1) >> iVar8 == 0; iVar8 = iVar8 + -1) {
            }
          }
          bVar5 = (byte)uVar11;
          std::__cxx11::string::resize
                    ((ulong)&sub_input.extension_factory_,(char)(iVar8 * 9 + 0x49U >> 6) + bVar5);
          if (uVar7 < 0x80) {
            *(byte *)&(sub_input.extension_factory_)->_vptr_MessageFactory = bVar5;
            buffer = (undefined1 *)((long)&(sub_input.extension_factory_)->_vptr_MessageFactory + 1)
            ;
          }
          else {
            *(byte *)&(sub_input.extension_factory_)->_vptr_MessageFactory = bVar5 | 0x80;
            uVar11 = uVar11 >> 7 & 0x1ffffff;
            if (uVar7 < 0x4000) {
              *(char *)((long)&(sub_input.extension_factory_)->_vptr_MessageFactory + 1) =
                   (char)uVar11;
              buffer = (undefined1 *)
                       ((long)&(sub_input.extension_factory_)->_vptr_MessageFactory + 2);
            }
            else {
              buffer = (undefined1 *)
                       ((long)&(sub_input.extension_factory_)->_vptr_MessageFactory + 2);
              do {
                puVar13 = buffer;
                uVar9 = (uint)uVar11;
                puVar13[-1] = (byte)uVar11 | 0x80;
                uVar10 = uVar9 >> 7;
                uVar11 = (ulong)uVar10;
                buffer = puVar13 + 1;
              } while (0x3fff < uVar9);
              *puVar13 = (char)uVar10;
            }
          }
          bVar6 = io::CodedInputStream::ReadRaw(input,buffer,uVar7);
          bVar3 = unaff_R13B & bVar6;
        }
        unaff_R13B = bVar3;
        bVar2 = false;
        if (bVar6 != false) goto LAB_0021a140;
        goto LAB_0021a142;
      }
      pbVar1 = input->buffer_;
      if (pbVar1 < input->buffer_end_) {
        bVar5 = *pbVar1;
        uVar11 = (ulong)bVar5;
        uVar14 = (uint32)bVar5;
        if ((char)bVar5 < '\0') goto LAB_00219f79;
        input->buffer_ = pbVar1 + 1;
        bVar6 = true;
      }
      else {
        uVar14 = 0;
LAB_00219f79:
        uVar11 = io::CodedInputStream::ReadVarint32Fallback(input,uVar14);
        bVar6 = -1 < (long)uVar11;
      }
      iVar8 = (int)uVar11;
      if (bVar6) {
        iVar12 = iVar8;
        if (message_data._M_dataplus._M_p == (pointer)0x0) {
          bVar6 = true;
        }
        else {
          local_b8 = (undefined1  [8])sub_input.extension_factory_;
          sub_input.input_._0_4_ = (uint32)message_data._M_dataplus._M_p;
          sub_input.buffer_ =
               (uint8 *)((long)&(sub_input.extension_factory_)->_vptr_MessageFactory +
                        (long)(int)(uint32)sub_input.input_);
          sub_input.buffer_end_ = (uint8 *)0x0;
          sub_input._20_8_ = 0;
          sub_input.overflow_bytes_._0_2_ = 0;
          sub_input.legitimate_message_end_ = false;
          sub_input.aliasing_enabled_ = false;
          sub_input._38_2_ = 0;
          sub_input.current_limit_ = 0x7fffffff;
          sub_input.recursion_limit_ = 0;
          sub_input._60_4_ = 0;
          sub_input.extension_pool_ = (DescriptorPool *)0x0;
          sub_input.buffer_size_after_limit_ = input->recursion_budget_;
          sub_input.last_tag_ = (uint32)sub_input.input_;
          sub_input.total_bytes_limit_ = sub_input.buffer_size_after_limit_;
          bVar6 = ParseField(this,iVar8 * 8 + 2,(CodedInputStream *)local_b8,extension_finder,
                             field_skipper);
          if (bVar6) {
            message_data._M_dataplus._M_p = (pointer)0x0;
            *(undefined1 *)&(sub_input.extension_factory_)->_vptr_MessageFactory = 0;
          }
          else {
            unaff_R13B = 0;
          }
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_b8);
        }
      }
      else {
        bVar6 = false;
        unaff_R13B = 0;
      }
      field_skipper = (FieldSkipper *)message_data.field_2._8_8_;
      if (bVar6 == false) {
        bVar2 = false;
      }
      else {
LAB_0021a140:
        bVar2 = true;
      }
    }
LAB_0021a142:
    if (!bVar2) {
      if (sub_input.extension_factory_ != (MessageFactory *)&message_data._M_string_length) {
        operator_delete(sub_input.extension_factory_);
      }
      return (bool)(unaff_R13B & 1);
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItemLite(io::CodedInputStream* input,
                                           ExtensionFinder* extension_finder,
                                           FieldSkipper* field_skipper) {
  struct MSLite {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      return me->ParseField(
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED + 8 * type_id, input,
          extension_finder, field_skipper);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return field_skipper->SkipField(input, tag);
    }

    ExtensionSet* me;
    ExtensionFinder* extension_finder;
    FieldSkipper* field_skipper;
  };

  return ParseMessageSetItemImpl(input,
                                 MSLite{this, extension_finder, field_skipper});
}